

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdcmpgif.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  gdImagePtr im1_00;
  gdImagePtr im2_00;
  FILE *in;
  gdImagePtr im2;
  gdImagePtr im1;
  char **argv_local;
  int argc_local;
  
  if (argc != 3) {
    fprintf(_stderr,"Usage: gdcmpgif filename.gif filename.gif\n");
    exit(1);
  }
  pFVar1 = fopen(argv[1],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Input file does not exist!\n");
    exit(1);
  }
  im1_00 = (gdImagePtr)gdImageCreateFromGif(pFVar1);
  fclose(pFVar1);
  if (im1_00 == (gdImagePtr)0x0) {
    fprintf(_stderr,"Input is not in GIF format!\n");
    exit(1);
  }
  pFVar1 = fopen(argv[2],"rb");
  if (pFVar1 == (FILE *)0x0) {
    fprintf(_stderr,"Input file 2 does not exist!\n");
    exit(1);
  }
  im2_00 = (gdImagePtr)gdImageCreateFromGif(pFVar1);
  fclose(pFVar1);
  if (im2_00 == (gdImagePtr)0x0) {
    fprintf(_stderr,"Input 2 is not in GIF format!\n");
    exit(1);
  }
  CompareImages("gdcmpgif",im1_00,im2_00);
  gdImageDestroy(im1_00);
  gdImageDestroy(im2_00);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im1, im2;
	FILE *in;

	if (argc != 3) {
		fprintf(stderr, "Usage: gdcmpgif filename.gif filename.gif\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im1 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im1) {
		fprintf(stderr, "Input is not in GIF format!\n");
		exit(1);
	}

	in = fopen(argv[2], "rb");
	if (!in) {
		fprintf(stderr, "Input file 2 does not exist!\n");
		exit(1);
	}
	im2 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im2) {
		fprintf(stderr, "Input 2 is not in GIF format!\n");
		exit(1);
	}

	CompareImages("gdcmpgif", im1, im2);

	gdImageDestroy(im1);
	gdImageDestroy(im2);

	return 0;
}